

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O0

void __thiscall miniros::ServiceClient::deserializeFailed(ServiceClient *this,exception *e)

{
  undefined8 uVar1;
  long *in_RSI;
  bool enabled;
  undefined8 in_stack_ffffffffffffff88;
  Level LVar2;
  LogLocation *in_stack_ffffffffffffff90;
  LogLocation *in_stack_ffffffffffffffa0;
  void *logger_handle;
  Level level;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  LogLocation *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  LVar2 = (Level)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (((console::g_initialized ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((deserializeFailed::loc.initialized_ ^ 0xffU) & 1) != 0) {
    level = (Level)((ulong)&stack0xffffffffffffffcf >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (allocator<char> *)in_stack_ffffffffffffffc0);
    console::initializeLogLocation
              (in_stack_ffffffffffffffc0,
               (string *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),level);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  if (deserializeFailed::loc.level_ != Error) {
    console::setLogLocationLevel(in_stack_ffffffffffffff90,LVar2);
    console::checkLogLocationEnabled(in_stack_ffffffffffffffa0);
  }
  LVar2 = deserializeFailed::loc.level_;
  if ((deserializeFailed::loc.logger_enabled_ & 1U) != 0) {
    logger_handle = deserializeFailed::loc.logger_;
    uVar1 = (**(code **)(*in_RSI + 0x10))();
    console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service_client.cpp"
                   ,0xd8,"void miniros::ServiceClient::deserializeFailed(const std::exception &)",
                   "Exception thrown while while deserializing service call: %s",uVar1);
  }
  return;
}

Assistant:

void ServiceClient::deserializeFailed(const std::exception& e)
{
  MINIROS_ERROR("Exception thrown while while deserializing service call: %s", e.what());
}